

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O1

void av1_collect_mv_stats(AV1_COMP *cpi,int current_q)

{
  long lVar1;
  BLOCK_SIZE bsize;
  uint uVar2;
  int iVar3;
  SequenceHeader *pSVar4;
  int mi_col;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int mi_row;
  int mi_row_00;
  TileInfo tile_info;
  TileInfo local_48;
  
  lVar8 = (long)(cpi->common).tiles.rows;
  if (0 < lVar8) {
    uVar2 = (cpi->common).tiles.cols;
    lVar10 = 0;
    do {
      av1_tile_set_row(&local_48,&cpi->common,(int)lVar10);
      if (0 < (int)uVar2) {
        uVar9 = 0;
        do {
          lVar1 = uVar9 + lVar10 * (ulong)uVar2;
          av1_tile_set_col(&local_48,&cpi->common,(int)uVar9);
          memcpy(&cpi->tile_data[lVar1].tctx,(cpi->common).fc,0x52fc);
          iVar7 = local_48.mi_col_end;
          iVar6 = local_48.mi_col_start;
          iVar5 = local_48.mi_row_end;
          (cpi->td).mb.e_mbd.tile_ctx = &cpi->tile_data[lVar1].tctx;
          if (local_48.mi_row_start < local_48.mi_row_end) {
            pSVar4 = (cpi->common).seq_params;
            iVar3 = pSVar4->mib_size;
            bsize = pSVar4->sb_size;
            mi_col = iVar6;
            mi_row_00 = local_48.mi_row_start;
            do {
              for (; mi_col < iVar7; mi_col = mi_col + iVar3) {
                collect_mv_stats_sb(&cpi->mv_stats,cpi,mi_row_00,mi_col,bsize);
              }
              mi_row_00 = mi_row_00 + iVar3;
              mi_col = iVar6;
            } while (mi_row_00 < iVar5);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar2);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar8);
  }
  (cpi->mv_stats).q = current_q;
  (cpi->mv_stats).order = (cpi->common).current_frame.order_hint;
  (cpi->mv_stats).valid = 1;
  return;
}

Assistant:

void av1_collect_mv_stats(AV1_COMP *cpi, int current_q) {
  MV_STATS *mv_stats = &cpi->mv_stats;
  const AV1_COMMON *cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    TileInfo tile_info;
    av1_tile_set_row(&tile_info, cm, tile_row);
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      const int tile_idx = tile_row * tile_cols + tile_col;
      av1_tile_set_col(&tile_info, cm, tile_col);
      cpi->tile_data[tile_idx].tctx = *cm->fc;
      cpi->td.mb.e_mbd.tile_ctx = &cpi->tile_data[tile_idx].tctx;
      collect_mv_stats_tile(mv_stats, cpi, &tile_info);
    }
  }

  mv_stats->q = current_q;
  mv_stats->order = cpi->common.current_frame.order_hint;
  mv_stats->valid = 1;
}